

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O0

NotificationHandle * __thiscall
jsonrpccxx::GetHandle<std::__cxx11::string_const&>
          (NotificationHandle *__return_storage_ptr__,jsonrpccxx *this,
          _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *f)

{
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *f_00;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_38;
  jsonrpccxx *local_18;
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *f_local;
  
  local_18 = this;
  f_local = (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
            __return_storage_ptr__;
  std::function<void(std::__cxx11::string_const&)>::
  function<void(*&)(std::__cxx11::string_const&),void>
            ((function<void(std::__cxx11::string_const&)> *)&local_38,
             (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr **)
             &local_18);
  GetHandle<std::__cxx11::string_const&>(__return_storage_ptr__,(jsonrpccxx *)&local_38,f_00);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_38);
  return __return_storage_ptr__;
}

Assistant:

NotificationHandle GetHandle(void (*f)(ParamTypes...)) {
    return GetHandle(std::function<void(ParamTypes...)>(f));
  }